

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O0

EStatusCode __thiscall TIFFImageHandler::ReadPhotometricPalette(TIFFImageHandler *this)

{
  ushort uVar1;
  int iVar2;
  Trace *pTVar3;
  undefined8 uVar4;
  uchar *puVar5;
  int local_34;
  long lStack_30;
  int i;
  uint16_t *b;
  uint16_t *g;
  uint16_t *r;
  TIFFImageHandler *pTStack_10;
  EStatusCode status;
  TIFFImageHandler *this_local;
  
  r._4_4_ = eSuccess;
  pTStack_10 = this;
  if (this->mT2p->tiff_samplesperpixel == 1) {
    this->mT2p->pdf_colorspace = T2P_CS_PALETTE|T2P_CS_RGB;
    this->mT2p->pdf_palettesize = (uint16_t)(1 << ((byte)this->mT2p->tiff_bitspersample & 0x1f));
    iVar2 = TIFFGetField(this->mT2p->input,0x140,&g,&b,&stack0xffffffffffffffd0);
    if (iVar2 == 0) {
      pTVar3 = Trace::DefaultTrace();
      uVar4 = std::__cxx11::string::c_str();
      Trace::TraceToLog(pTVar3,
                        "TIFFImageHandler::ReadTIFFPageInformation, Palettized image %s has no color map"
                        ,uVar4);
      r._4_4_ = eFailure;
    }
    else {
      if (this->mT2p->pdf_palette != (uchar *)0x0) {
        _TIFFfree(this->mT2p->pdf_palette);
        this->mT2p->pdf_palette = (uchar *)0x0;
      }
      puVar5 = (uchar *)_TIFFmalloc((long)(int)((uint)this->mT2p->pdf_palettesize * 3));
      this->mT2p->pdf_palette = puVar5;
      if (this->mT2p->pdf_palette == (uchar *)0x0) {
        pTVar3 = Trace::DefaultTrace();
        uVar1 = this->mT2p->pdf_palettesize;
        uVar4 = std::__cxx11::string::c_str();
        Trace::TraceToLog(pTVar3,
                          "TIFFImageHandler::ReadTIFFPageInformation, Can\'t allocate %u bytes of memory for t2p_read_tiff_image, %s"
                          ,(ulong)uVar1,uVar4);
        r._4_4_ = eFailure;
      }
      else {
        for (local_34 = 0; local_34 < (int)(uint)this->mT2p->pdf_palettesize;
            local_34 = local_34 + 1) {
          this->mT2p->pdf_palette[local_34 * 3] = (uchar)(g[local_34] >> 8);
          this->mT2p->pdf_palette[local_34 * 3 + 1] = (uchar)(b[local_34] >> 8);
          this->mT2p->pdf_palette[local_34 * 3 + 2] =
               (uchar)((ushort)*(undefined2 *)(lStack_30 + (long)local_34 * 2) >> 8);
        }
        this->mT2p->pdf_palettesize = this->mT2p->pdf_palettesize * 3;
      }
    }
  }
  else {
    pTVar3 = Trace::DefaultTrace();
    uVar4 = std::__cxx11::string::c_str();
    Trace::TraceToLog(pTVar3,
                      "TIFFImageHandler::ReadTIFFPageInformation, No support for palettized image %s with not one sample per pixel"
                      ,uVar4);
    r._4_4_ = eFailure;
  }
  return r._4_4_;
}

Assistant:

EStatusCode TIFFImageHandler::ReadPhotometricPalette()
{
	EStatusCode status = PDFHummus::eSuccess;
	uint16_t* r;
	uint16_t* g;
	uint16_t* b;

	do
	{
		if(mT2p->tiff_samplesperpixel!=1)
		{
			TRACE_LOG1(
				"TIFFImageHandler::ReadTIFFPageInformation, No support for palettized image %s with not one sample per pixel",
				mT2p->inputFilePath.c_str());
			status = PDFHummus::eFailure;
			break;
		}
		mT2p->pdf_colorspace= (t2p_cs_t)(T2P_CS_RGB | T2P_CS_PALETTE);
		mT2p->pdf_palettesize=0x0001<<mT2p->tiff_bitspersample;
		if(!TIFFGetField(mT2p->input, TIFFTAG_COLORMAP, &r, &g, &b))
		{
			TRACE_LOG1(
				"TIFFImageHandler::ReadTIFFPageInformation, Palettized image %s has no color map",
				mT2p->inputFilePath.c_str());
			status = PDFHummus::eFailure;
			break;
		} 
		if(mT2p->pdf_palette != NULL)
		{
			_TIFFfree(mT2p->pdf_palette);
			mT2p->pdf_palette=NULL;
		}
		mT2p->pdf_palette = (unsigned char*)
			_TIFFmalloc(mT2p->pdf_palettesize*3);
		if(mT2p->pdf_palette==NULL)
		{
			TRACE_LOG2(
				"TIFFImageHandler::ReadTIFFPageInformation, Can't allocate %u bytes of memory for t2p_read_tiff_image, %s",
				mT2p->pdf_palettesize,
				mT2p->inputFilePath.c_str()
				);
			status = PDFHummus::eFailure;
			break;
		}
		for(int i=0;i<mT2p->pdf_palettesize;i++)
		{
			mT2p->pdf_palette[(i*3)]  = (unsigned char) (r[i]>>8);
			mT2p->pdf_palette[(i*3)+1]= (unsigned char) (g[i]>>8);
			mT2p->pdf_palette[(i*3)+2]= (unsigned char) (b[i]>>8);
		}
		mT2p->pdf_palettesize *= 3;
	}while(false);

	return status;
}